

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int nsc_line_to_tag(char *buf,size_t size,char *tag,size_t max_tag,lws_usec_t *pexpiry)

{
  ulong uVar1;
  ulong uVar2;
  longlong lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  char col [64];
  long local_a0;
  int local_88;
  char local_78 [72];
  
  iVar8 = 1;
  if (2 < size) {
    uVar5 = 0;
    local_a0 = 0;
    iVar8 = 0;
    uVar6 = 0;
    do {
      uVar2 = 0;
      do {
        if (buf[uVar2 + uVar5] == '\t') {
          lVar4 = uVar5 + uVar2;
          uVar5 = 1;
          goto LAB_0010ffe4;
        }
        uVar1 = uVar2 + 1;
        local_78[uVar2] = buf[uVar2 + uVar5];
      } while ((uVar2 + uVar5 + 1 < size) && (bVar9 = uVar2 < 0x3e, uVar2 = uVar1, bVar9));
      lVar4 = uVar5 + uVar1;
      uVar5 = (ulong)(buf[lVar4] == '\t');
      uVar2 = uVar1;
LAB_0010ffe4:
      local_78[uVar2 & 0xffffffff] = '\0';
      switch(uVar6) {
      case 0:
      case 2:
      case 5:
        local_88 = (int)max_tag;
        if (local_88 < (int)uVar2 + iVar8 + 2) {
          return 1;
        }
        if (iVar8 == 0) {
          iVar7 = 0;
        }
        else {
          iVar7 = iVar8 + 1;
          tag[iVar8] = '|';
        }
        memcpy(tag + iVar7,local_78,uVar2 & 0xffffffff);
        iVar8 = iVar7 + (int)uVar2;
        tag[iVar8] = '\0';
        break;
      case 4:
        lVar3 = atoll(local_78);
        local_a0 = lVar3 * 1000000;
      }
      uVar5 = lVar4 + uVar5;
    } while ((uVar5 < size) && (bVar9 = uVar6 < 5, uVar6 = uVar6 + 1, bVar9));
    if (pexpiry != (lws_usec_t *)0x0) {
      *pexpiry = local_a0;
    }
    iVar8 = 0;
    _lws_log(8,"%s: %.*s: tag \'%s\'\n","nsc_line_to_tag",size & 0xffffffff,buf,tag);
  }
  return iVar8;
}

Assistant:

static int
nsc_line_to_tag(const char *buf, size_t size, char *tag, size_t max_tag,
		lws_usec_t *pexpiry)
{
	int n, idx = 0, tl = 0;
	lws_usec_t expiry = 0;
	size_t bn = 0;
	char col[64];

	if (size < 3)
		return 1;

	while (bn < size && idx <= NSC_COL_NAME) {

		n = 0;
		while (bn < size && n < (int)sizeof(col) - 1 &&
		       buf[bn] != '\t')
			col[n++] = buf[bn++];
		col[n] = '\0';
		if (buf[bn] == '\t')
			bn++;

		switch (idx) {
		case NSC_COL_EXPIRY:
			expiry = (lws_usec_t)((unsigned long long)atoll(col) *
					(lws_usec_t)LWS_US_PER_SEC);
			break;

		case NSC_COL_HOST:
		case NSC_COL_PATH:
		case NSC_COL_NAME:

			/*
			 * As we match the pieces of the wildcard,
			 * compose the matches into a specific tag
			 */

			if (tl + n + 2 > (int)max_tag)
				return 1;
			if (tl)
				tag[tl++] = LWSCTAG_SEP;
			memcpy(tag + tl, col, (size_t)n);
			tl += n;
			tag[tl] = '\0';
			break;
		default:
			break;
		}

		idx++;
	}

	if (pexpiry)
		*pexpiry = expiry;

	lwsl_info("%s: %.*s: tag '%s'\n", __func__, (int)size, buf, tag);

	return 0;
}